

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_vtlb.c
# Opt level: O1

_Bool unicorn_fill_tlb_m68k
                (CPUState *cs,vaddr address,int size,MMUAccessType rw,int mmu_idx,_Bool probe,
                uintptr_t retaddr)

{
  uc_struct_conflict7 *puVar1;
  void *pvVar2;
  byte bVar3;
  bool bVar4;
  list_item *plVar5;
  undefined7 in_register_00000089;
  ulong uVar6;
  uint uVar7;
  byte bVar8;
  ulong local_50;
  uint local_48;
  uint local_40;
  int local_3c;
  CPUState *local_38;
  
  uVar6 = CONCAT71(in_register_00000089,probe);
  puVar1 = cs->uc;
  plVar5 = puVar1->hook[0x11].head;
  uVar7 = (uint)address;
  if (plVar5 == (list_item *)0x0) {
    bVar3 = 0;
    bVar4 = false;
  }
  else {
    local_40 = (uint)uVar6;
    bVar8 = 0x12;
    if (rw != MMU_INST_FETCH) {
      bVar8 = rw == MMU_DATA_STORE | 0x10;
    }
    bVar4 = false;
    bVar3 = 0;
    local_3c = mmu_idx;
    local_38 = cs;
    do {
      pvVar2 = plVar5->data;
      if (pvVar2 == (void *)0x0) break;
      if ((*(char *)((long)pvVar2 + 0x14) == '\0') &&
         (((*(ulong *)((long)pvVar2 + 0x18) <= address &&
           (address <= *(ulong *)((long)pvVar2 + 0x20))) ||
          (*(ulong *)((long)pvVar2 + 0x20) < *(ulong *)((long)pvVar2 + 0x18))))) {
        bVar3 = (**(code **)((long)pvVar2 + 0x28))
                          (puVar1,uVar7 & 0xfffff000,bVar8,&local_50,
                           *(undefined8 *)((long)pvVar2 + 0x30));
        bVar4 = true;
        if (bVar3 != 0) break;
      }
      plVar5 = plVar5->next;
    } while (plVar5 != (list_item *)0x0);
    uVar6 = (ulong)local_40;
    cs = local_38;
    mmu_idx = local_3c;
  }
  if (bVar4) {
    if ((bVar3 & 1) == 0) goto LAB_006ebdbe;
  }
  else {
    local_50 = (ulong)(uVar7 & 0xfffff000);
    local_48 = 0;
    if (rw < (MMU_INST_FETCH|MMU_DATA_STORE)) {
      local_48 = *(uint *)(&DAT_00d85670 + (ulong)rw * 4);
    }
  }
  if (rw == MMU_INST_FETCH) {
    bVar3 = (byte)local_48 >> 2;
  }
  else if (rw == MMU_DATA_STORE) {
    bVar3 = (byte)local_48 >> 1;
  }
  else {
    bVar3 = (byte)local_48;
    if (rw != MMU_DATA_LOAD) {
      bVar3 = 0;
    }
  }
  if ((bVar3 & 1) != 0) {
    tlb_set_page_m68k(cs,uVar7 & 0xfffff000,(ulong)((uint)local_50 & 0xfffff000),local_48 & 7,
                      mmu_idx,0x1000);
    return true;
  }
LAB_006ebdbe:
  if ((char)uVar6 != '\0') {
    return false;
  }
  puVar1 = cs->uc;
  puVar1->invalid_error = 0x15;
  puVar1->invalid_addr = address & 0xffffffff;
  cpu_exit(puVar1->cpu);
  cpu_loop_exit_restore_m68k(cs,retaddr);
}

Assistant:

bool unicorn_fill_tlb(CPUState *cs, vaddr address, int size,
                      MMUAccessType rw, int mmu_idx,
                      bool probe, uintptr_t retaddr)
{
    bool handled = false;
    bool ret = false;
    struct uc_struct *uc = cs->uc;
    uc_tlb_entry e;
    struct hook *hook;
    HOOK_FOREACH_VAR_DECLARE;

    HOOK_FOREACH(uc, hook, UC_HOOK_TLB_FILL) {
        if (hook->to_delete) {
            continue;
        }
        if (!HOOK_BOUND_CHECK(hook, address)) {
            continue;
        }
        handled = true;
        if ((ret = ((uc_cb_tlbevent_t)hook->callback)(uc, address & TARGET_PAGE_MASK, rw_to_mem_type(rw), &e, hook->user_data))) {
            break;
        }
    }

    if (handled && !ret) {
        goto tlb_miss;
    }

    if (!handled) {
        e.paddr = address & TARGET_PAGE_MASK;
        switch (rw) {
        case MMU_DATA_LOAD:
            e.perms = UC_PROT_READ;
            break;
        case MMU_DATA_STORE:
            e.perms = UC_PROT_WRITE;
            break;
        case MMU_INST_FETCH:
            e.perms = UC_PROT_EXEC;
            break;
        default:
            e.perms = 0;
            break;
        }
    }

    switch (rw) {
    case MMU_DATA_LOAD:
        ret = e.perms & UC_PROT_READ;
        break;
    case MMU_DATA_STORE:
        ret = e.perms & UC_PROT_WRITE;
        break;
    case MMU_INST_FETCH:
        ret = e.perms & UC_PROT_EXEC;
        break;
    default:
        ret = false;
        break;
    }

    if (ret) {
        tlb_set_page(cs, address & TARGET_PAGE_MASK, e.paddr & TARGET_PAGE_MASK, perms_to_prot(e.perms), mmu_idx, TARGET_PAGE_SIZE);
        return true;
    }

tlb_miss:
    if (probe) {
        return false;
    }
    raise_mmu_exception(cs, address, rw, retaddr);
    return false;
}